

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverPoolTest_CompileDefaultsRemovedOnly_Test::
~FeatureResolverPoolTest_CompileDefaultsRemovedOnly_Test
          (FeatureResolverPoolTest_CompileDefaultsRemovedOnly_Test *this)

{
  (this->super_FeatureResolverPoolTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FeatureResolverPoolTest_018f3240;
  FeatureSetDefaults::~FeatureSetDefaults(&(this->super_FeatureResolverPoolTest).defaults_);
  FileDescriptorProto::~FileDescriptorProto(&(this->super_FeatureResolverPoolTest).file_proto_);
  DescriptorPool::~DescriptorPool(&(this->super_FeatureResolverPoolTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1c0);
  return;
}

Assistant:

TEST_F(FeatureResolverPoolTest, CompileDefaultsRemovedOnly) {
  const FileDescriptor* file = ParseSchema(R"schema(
    syntax = "proto2";
    package test;
    import "google/protobuf/descriptor.proto";

    extend google.protobuf.FeatureSet {
      optional Foo bar = 9999;
    }
    enum Bar {
      TEST_ENUM_FEATURE_UNKNOWN = 0;
      VALUE1 = 1;
      VALUE2 = 2;
    }
    message Foo {
      optional Bar file_feature = 1 [
        targets = TARGET_TYPE_FIELD,
        feature_support.edition_introduced = EDITION_2023,
        feature_support.edition_removed = EDITION_99998_TEST_ONLY,
        edition_defaults = { edition: EDITION_LEGACY, value: "VALUE1" }
      ];
    }
  )schema");
  ASSERT_NE(file, nullptr);

  const FieldDescriptor* ext = file->extension(0);
  auto compiled_defaults = FeatureResolver::CompileDefaults(
      feature_set_, {ext}, EDITION_99997_TEST_ONLY, EDITION_99999_TEST_ONLY);
  ASSERT_OK(compiled_defaults);
  const auto& defaults = *compiled_defaults->defaults().rbegin();
  EXPECT_THAT(defaults.edition(), EDITION_99998_TEST_ONLY);
  EXPECT_THAT(defaults.fixed_features().GetExtension(pb::test).file_feature(),
              pb::VALUE1);
  EXPECT_FALSE(defaults.overridable_features()
                   .GetExtension(pb::test)
                   .has_file_feature());
}